

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem02.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  
  lVar1 = 2;
  lVar4 = 3;
  do {
    lVar2 = lVar1 + lVar4;
    lVar1 = lVar4;
    lVar4 = lVar2;
  } while (lVar2 < 0x3d0901);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    long sum=2;
    long oo=1;
    long o=2;
    long n=3;
    while (n<=4e6) {
        if (n%2==0) sum+=n;
        oo=o;
        o=n;

        n=o+oo;
    }

    cout<<sum<<endl;
}